

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

void __thiscall pbrt::MLTSampler::EnsureReady(MLTSampler *this,int index)

{
  PrimarySample *pPVar1;
  PrimarySample *pPVar2;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [16];
  byte bVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  Float FVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [12];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  undefined1 extraout_var [60];
  
  auVar16 = in_ZMM1._0_16_;
  auVar17 = in_ZMM2._4_12_;
  auVar10 = in_ZMM0._0_16_;
  uVar9 = (ulong)index;
  if ((this->X).nStored <= uVar9) {
    pstd::
    vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
    ::resize(&this->X,(long)(index + 1));
  }
  pPVar2 = (this->X).ptr;
  lVar3 = this->lastLargeStepIteration;
  pPVar1 = pPVar2 + uVar9;
  lVar7 = pPVar2[uVar9].lastModificationIteration;
  if (lVar7 < lVar3) {
    uVar9 = (this->rng).state;
    uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
    bVar6 = (byte)(uVar9 >> 0x3b);
    auVar10 = vcvtusi2ss_avx512f(auVar10,uVar8 >> bVar6 | uVar8 << 0x20 - bVar6);
    auVar10 = vminss_avx(ZEXT416((uint)(auVar10._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    FVar11 = auVar10._0_4_;
    (this->rng).state = uVar9 * 0x5851f42d4c957f2d + (this->rng).inc;
    pPVar1->value = FVar11;
    pPVar1->lastModificationIteration = lVar3;
    lVar7 = lVar3;
  }
  else {
    FVar11 = pPVar1->value;
  }
  pPVar1->valueBackup = FVar11;
  pPVar1->modifyBackup = lVar7;
  if (this->largeStep == true) {
    uVar9 = (this->rng).state;
    uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
    bVar6 = (byte)(uVar9 >> 0x3b);
    auVar10 = vcvtusi2ss_avx512f(auVar16,uVar8 >> bVar6 | uVar8 << 0x20 - bVar6);
    (this->rng).state = uVar9 * 0x5851f42d4c957f2d + (this->rng).inc;
    auVar10 = vminss_avx(ZEXT416((uint)(auVar10._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    fVar12 = auVar10._0_4_;
  }
  else {
    fVar12 = this->sigma;
    auVar10._0_4_ = (float)(this->currentIteration - lVar7);
    auVar10._4_12_ = auVar17;
    if (auVar10._0_4_ < 0.0) {
      fVar13 = sqrtf(auVar10._0_4_);
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar13 = auVar10._0_4_;
    }
    uVar9 = (this->rng).state;
    uVar8 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
    bVar6 = (byte)(uVar9 >> 0x3b);
    auVar10 = vcvtusi2ss_avx512f(in_XMM3,uVar8 >> bVar6 | uVar8 << 0x20 - bVar6);
    (this->rng).state = uVar9 * 0x5851f42d4c957f2d + (this->rng).inc;
    auVar10 = vminss_avx(ZEXT416((uint)(auVar10._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar10,ZEXT416(0xbf800000));
    auVar10 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar16,auVar16);
    auVar10 = vmaxss_avx(SUB6416(ZEXT464(0x800000),0),auVar10);
    auVar15._0_4_ = logf(auVar10._0_4_);
    auVar15._4_60_ = extraout_var;
    if (0x7f7fffff < (uint)ABS(auVar15._0_4_)) {
      LogFatal<char_const(&)[28]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.h"
                 ,0x2a6,"Check failed: %s",(char (*) [28])"!IsNaN(t) && !std::isinf(t)");
    }
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar14 = auVar15._0_16_;
    auVar10 = vandps_avx512vl(auVar14,auVar5);
    if (auVar10._0_4_ <= 6.125) {
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0x31bae000),0),auVar14,ZEXT416(0x3419da2c));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x35a4c94e));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x33f295dd));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0xb86b8609));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0xb91adf4d));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x3b17b201));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x3c3d0f26));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0xbe6d9577));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x3f62dfc4));
      fVar4 = auVar10._0_4_;
    }
    else {
      auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0x2fa6f5a2),0),auVar14,ZEXT416(0x32fbe4d7));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x35a3f289));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x37ee53ef));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x39ce55c9));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x3b46606f));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x3b9e5490));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0xbe877fb3));
      auVar10 = vfmadd213ss_fma(auVar10,auVar14,ZEXT416(0x3f570b52));
      fVar4 = auVar10._0_4_;
    }
    auVar10 = vfmadd231ss_fma(ZEXT816(0) << 0x20,ZEXT416((uint)(fVar13 * fVar12 * 1.4142135)),
                              ZEXT416((uint)(fVar4 * auVar16._0_4_)));
    fVar12 = auVar10._0_4_ + pPVar1->value;
    auVar10 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),9);
    fVar12 = fVar12 - auVar10._0_4_;
  }
  pPVar1->value = fVar12;
  pPVar1->lastModificationIteration = this->currentIteration;
  return;
}

Assistant:

void MLTSampler::EnsureReady(int index) {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("MLTSampler not supported on GPU--needs vector resize...");
    return;
#else
    // Enlarge _MLTSampler::X_ if necessary and get current $\VEC{X}_i$
    if (index >= X.size())
        X.resize(index + 1);
    PrimarySample &Xi = X[index];

    // Reset $\VEC{X}_i$ if a large step took place in the meantime
    if (Xi.lastModificationIteration < lastLargeStepIteration) {
        Xi.value = rng.Uniform<Float>();
        Xi.lastModificationIteration = lastLargeStepIteration;
    }

    // Apply remaining sequence of mutations to _sample_
    Xi.Backup();
    if (largeStep) {
        Xi.value = rng.Uniform<Float>();
    } else {
        int64_t nSmall = currentIteration - Xi.lastModificationIteration;
        // Apply _nSmall_ small step mutations to $\VEC{X}_i$
        Float effSigma = sigma * std::sqrt((Float)nSmall);
        Float delta = SampleNormal(rng.Uniform<Float>(), 0, effSigma);
        Xi.value += delta;
        Xi.value -= std::floor(Xi.value);
    }
    Xi.lastModificationIteration = currentIteration;

#endif
}